

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O1

void * __thiscall CVmGramProdMem::alloc(CVmGramProdMem *this,size_t siz)

{
  char *pcVar1;
  CVmGramProdMemBlock *pCVar2;
  CVmGramProdMemBlock *pCVar3;
  ulong uVar4;
  
  uVar4 = siz + 7 & 0xfffffffffffffff8;
  if (0x4000 < uVar4) {
    return (void *)0x0;
  }
  if (uVar4 <= this->cur_rem_) goto LAB_00267193;
  pCVar2 = this->block_cur_;
  if (pCVar2 == (CVmGramProdMemBlock *)0x0) {
    pCVar2 = (CVmGramProdMemBlock *)malloc(0x4008);
    this->block_head_ = pCVar2;
LAB_00267174:
    this->block_cur_ = pCVar2;
    pCVar2->nxt_ = (CVmGramProdMemBlock *)0x0;
  }
  else {
    if (pCVar2->nxt_ == (CVmGramProdMemBlock *)0x0) {
      pCVar3 = (CVmGramProdMemBlock *)malloc(0x4008);
      pCVar2->nxt_ = pCVar3;
      pCVar2 = this->block_cur_->nxt_;
      goto LAB_00267174;
    }
    this->block_cur_ = pCVar2->nxt_;
  }
  this->cur_free_ = this->block_cur_->buf_;
  this->cur_rem_ = 0x4000;
LAB_00267193:
  pcVar1 = this->cur_free_;
  this->cur_free_ = pcVar1 + uVar4;
  this->cur_rem_ = this->cur_rem_ - uVar4;
  return pcVar1;
}

Assistant:

void *alloc(size_t siz)
    {
        void *ret;
        
        /* round the size to the local hardware boundary */
        siz = osrndsz(siz);

        /* if it exceeds the block size, fail */
        if (siz > VMGRAMPROD_MEM_BLOCK_SIZE)
            return 0;

        /* if we don't have enough space in this block, go to the next */
        if (siz > cur_rem_)
        {
            /* allocate a new block if necessary */
            if (block_cur_ == 0)
            {
                /* there's nothing in the list yet - set up the first block */
                block_head_ = (CVmGramProdMemBlock *)
                              t3malloc(sizeof(CVmGramProdMemBlock));

                /* activate the new block */
                block_cur_ = block_head_;

                /* there's nothing after this block */
                block_cur_->nxt_ = 0;
            }
            else if (block_cur_->nxt_ == 0)
            {
                /* we're at the end of the list - add a block */
                block_cur_->nxt_ = (CVmGramProdMemBlock *)
                                   t3malloc(sizeof(CVmGramProdMemBlock));

                /* advance to the new block */
                block_cur_ = block_cur_->nxt_;

                /* the new block is the last in the chain */
                block_cur_->nxt_ = 0;
            }
            else
            {
                /* another block follows - advance to it */
                block_cur_ = block_cur_->nxt_;
            }

            /* start at the beginning of the new block */
            cur_free_ = block_cur_->buf_;

            /* this entire block is available */
            cur_rem_ = VMGRAMPROD_MEM_BLOCK_SIZE;
        }

        /* the return value will be the current free pointer */
        ret = cur_free_;

        /* consume the space */
        cur_free_ += siz;
        cur_rem_ -= siz;

        /* return the block location */
        return ret;
    }